

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O1

int wait_for_edge(uint user_gpio,uint edge,double timeout)

{
  uint id;
  int iVar1;
  int triggered;
  timeval tv;
  int local_44;
  double local_40;
  double local_38;
  double local_30;
  timeval local_28;
  
  local_44 = 0;
  iVar1 = 0;
  if (0.0 < timeout) {
    local_30 = timeout;
    gettimeofday(&local_28,(__timezone_ptr_t)0x0);
    local_38 = (double)local_28.tv_sec;
    local_40 = (double)local_28.tv_usec;
    id = intCallback(user_gpio,edge,_wfe,&local_44,1);
    if (local_44 == 0) {
      local_40 = local_40 / 1000000.0 + local_38 + local_30;
      do {
        gettimeofday(&local_28,(__timezone_ptr_t)0x0);
        if (local_40 <= (double)local_28.tv_usec / 1000000.0 + (double)local_28.tv_sec) break;
        time_sleep(0.1);
      } while (local_44 == 0);
    }
    callback_cancel(id);
    iVar1 = local_44;
  }
  return iVar1;
}

Assistant:

int wait_for_edge(unsigned user_gpio, unsigned edge, double timeout)
{
   int triggered = 0;
   int id;
   double due;

   if (timeout <= 0.0) return 0;

   due = time_time() + timeout;

   id = callback_ex(user_gpio, edge, _wfe, &triggered);

   while (!triggered && (time_time() < due)) time_sleep(0.1);

   callback_cancel(id);

   return triggered;
}